

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

uint32 __thiscall crnd::dxt3_block::get_alpha(dxt3_block *this,uint32 x,uint32 y,bool scaled)

{
  uint uVar1;
  undefined7 in_register_00000009;
  uint uVar2;
  
  uVar2 = this->m_alpha[(x >> 1) + y * 2] >> ((char)x * '\x04' & 4U) & 0xf;
  uVar1 = uVar2 << 4;
  if ((int)CONCAT71(in_register_00000009,scaled) == 0) {
    uVar1 = 0;
  }
  return uVar1 | uVar2;
}

Assistant:

uint32 dxt3_block::get_alpha(uint32 x, uint32 y, bool scaled) const {
  CRND_ASSERT((x < cDXTBlockSize) && (y < cDXTBlockSize));

  uint32 value = m_alpha[(y << 1U) + (x >> 1U)];
  if (x & 1)
    value >>= 4;
  value &= 0xF;

  if (scaled)
    value = (value << 4U) | value;

  return value;
}